

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O3

void __thiscall
duckdb::TableFilterSet::PushFilter
          (TableFilterSet *this,ColumnIndex *col_idx,
          unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *filter)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  mapped_type *pmVar3;
  pointer pTVar4;
  ConjunctionAndFilter *pCVar5;
  TableFilter *this_00;
  pointer pCVar6;
  _Base_ptr p_Var7;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var8;
  _Base_ptr p_Var9;
  _Base_ptr *this_01;
  idx_t column_index;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_30;
  ulong local_28;
  
  local_28 = col_idx->index;
  p_Var7 = (this->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->filters)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var7 + 1) >= local_28) {
        p_Var9 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < local_28];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != p_Var1) && (*(ulong *)(p_Var9 + 1) <= local_28)) {
      this_01 = &p_Var9[1]._M_parent;
      pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)this_01);
      if (pTVar4->filter_type == CONJUNCTION_AND) {
        pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)this_01);
        pCVar5 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(pTVar4);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                    *)&(pCVar5->super_ConjunctionFilter).child_filters,filter);
        return;
      }
      this_00 = (TableFilter *)operator_new(0x28);
      ConjunctionAndFilter::ConjunctionAndFilter((ConjunctionAndFilter *)this_00);
      local_30._M_head_impl = this_00;
      pCVar6 = unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                             *)&local_30);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                  *)&(pCVar6->super_ConjunctionFilter).child_filters,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 this_01);
      pCVar6 = unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                             *)&local_30);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                  *)&(pCVar6->super_ConjunctionFilter).child_filters,filter);
      _Var8._M_head_impl = local_30._M_head_impl;
      local_30._M_head_impl = (TableFilter *)0x0;
      pmVar3 = ::std::
               map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               ::operator[](&this->filters,&local_28);
      _Var2._M_head_impl =
           (pmVar3->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      (pmVar3->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
      _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var8._M_head_impl;
      _Var8._M_head_impl = local_30._M_head_impl;
      if (_Var2._M_head_impl != (TableFilter *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableFilter + 8))();
        _Var8._M_head_impl = local_30._M_head_impl;
      }
      goto LAB_00e20869;
    }
  }
  pmVar3 = ::std::
           map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
           ::operator[](&this->filters,&local_28);
  _Var2._M_head_impl =
       (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
       _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
  super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
  _Var8._M_head_impl =
       (pmVar3->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
       _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  (pmVar3->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
  super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var2._M_head_impl;
LAB_00e20869:
  if (_Var8._M_head_impl != (TableFilter *)0x0) {
    (*(_Var8._M_head_impl)->_vptr_TableFilter[1])();
  }
  return;
}

Assistant:

void TableFilterSet::PushFilter(const ColumnIndex &col_idx, unique_ptr<TableFilter> filter) {
	auto column_index = col_idx.GetPrimaryIndex();
	auto entry = filters.find(column_index);
	if (entry == filters.end()) {
		// no filter yet: push the filter directly
		filters[column_index] = std::move(filter);
	} else {
		// there is already a filter: AND it together
		if (entry->second->filter_type == TableFilterType::CONJUNCTION_AND) {
			auto &and_filter = entry->second->Cast<ConjunctionAndFilter>();
			and_filter.child_filters.push_back(std::move(filter));
		} else {
			auto and_filter = make_uniq<ConjunctionAndFilter>();
			and_filter->child_filters.push_back(std::move(entry->second));
			and_filter->child_filters.push_back(std::move(filter));
			filters[column_index] = std::move(and_filter);
		}
	}
}